

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5HeapArgumentsObject::SetEnumerableForFormal
          (ES5HeapArgumentsObject *this,uint32 index,PropertyId propertyId,BOOL value)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  undefined1 local_30 [4];
  BOOL result;
  AutoObjectArrayItemExistsValidator autoItemAddRelease;
  BOOL value_local;
  PropertyId propertyId_local;
  uint32 index_local;
  ES5HeapArgumentsObject *this_local;
  
  autoItemAddRelease.m_index = value;
  BVar3 = HeapArgumentsObject::IsFormalArgument(&this->super_HeapArgumentsObject,index);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                ,0x2e1,"(this->IsFormalArgument(index))",
                                "SetAccessorsForFormal: called for non-formal");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  AutoObjectArrayItemExistsValidator::AutoObjectArrayItemExistsValidator
            ((AutoObjectArrayItemExistsValidator *)local_30,this,index);
  BVar3 = DynamicObject::SetEnumerable((DynamicObject *)this,propertyId,autoItemAddRelease.m_index);
  autoItemAddRelease.m_args._0_1_ = (BVar3 != 0 ^ 0xffU) & 1;
  AutoObjectArrayItemExistsValidator::~AutoObjectArrayItemExistsValidator
            ((AutoObjectArrayItemExistsValidator *)local_30);
  return BVar3;
}

Assistant:

BOOL ES5HeapArgumentsObject::SetEnumerableForFormal(uint32 index, PropertyId propertyId, BOOL value)
    {
        AssertMsg(this->IsFormalArgument(index), "SetAccessorsForFormal: called for non-formal");

        AutoObjectArrayItemExistsValidator autoItemAddRelease(this, index);

        BOOL result = this->DynamicObject::SetEnumerable(propertyId, value);
        autoItemAddRelease.m_isReleaseItemNeeded = !result;

        return result;
    }